

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void pnga_sprs_array_column_distribution(Integer s_a,Integer iproc,Integer *lo,Integer *hi)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar1 = SPA[s_a + 1000].jdim;
  lVar2 = SPA[s_a + 1000].nprocs;
  lVar3 = (lVar1 * iproc) / lVar2;
  lVar8 = lVar3 + -1;
  lVar7 = lVar2 * lVar8;
  lVar6 = (lVar3 + -2) * lVar2;
  lVar3 = lVar3 * lVar2;
  do {
    lVar4 = lVar3 / lVar1;
    lVar7 = lVar7 + lVar2;
    lVar6 = lVar6 + lVar2;
    lVar8 = lVar8 + 1;
    lVar3 = lVar3 + lVar2;
  } while (lVar4 < iproc);
  *lo = lVar8;
  if (iproc < lVar7 / lVar1) {
    do {
      lVar8 = lVar8 + -1;
      lVar3 = lVar6 / lVar1;
      lVar6 = lVar6 - lVar2;
    } while (iproc < lVar3);
    *lo = lVar8;
  }
  lVar8 = lVar1;
  if (iproc < lVar2 + -1) {
    lVar3 = iproc + 1;
    lVar6 = (lVar1 * lVar3) / lVar2;
    lVar8 = lVar6 + -1;
    lVar4 = lVar2 * lVar8;
    lVar7 = (lVar6 + -2) * lVar2;
    lVar6 = lVar6 * lVar2;
    do {
      lVar5 = lVar6 / lVar1;
      lVar4 = lVar4 + lVar2;
      lVar7 = lVar7 + lVar2;
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + lVar2;
    } while (lVar5 <= iproc);
    *hi = lVar8;
    if (lVar3 < lVar4 / lVar1) {
      do {
        lVar8 = lVar8 + -1;
        lVar6 = lVar7 / lVar1;
        lVar7 = lVar7 - lVar2;
      } while (lVar3 < lVar6);
      *hi = lVar8;
    }
  }
  *hi = lVar8 + -1;
  return;
}

Assistant:

void pnga_sprs_array_column_distribution(Integer s_a, Integer iproc, Integer *lo,
    Integer *hi)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer nproc = SPA[hdl].nprocs;
  Integer jdim = SPA[hdl].jdim;
  *lo = (SPA[hdl].jdim*iproc)/nproc;
  while (((*lo)*nproc)/jdim < iproc) {
    (*lo)++;
  }
  while (((*lo)*nproc)/jdim > iproc) {
    (*lo)--;
  }
  if (iproc < nproc-1) {
    (*hi) = (jdim*(iproc+1))/nproc;
    while (((*hi)*nproc)/jdim < iproc+1) {
      (*hi)++;
    }
    while (((*hi)*nproc)/jdim > iproc+1) {
      (*hi)--;
    }
    (*hi)--;
  } else {
    *hi = jdim-1;
  }
}